

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_sectors.cxx
# Opt level: O0

void __thiscall level_tools::reconstruct_sectors(level_tools *this)

{
  ushort uVar1;
  vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_> *this_00;
  bool bVar2;
  uint16_t uVar3;
  xr_level_sectors *pxVar4;
  xr_scene_sectors *this_01;
  xr_custom_object_vec *pxVar5;
  size_type sVar6;
  xr_sector_object *this_02;
  string *psVar7;
  uint32_t *puVar8;
  uint8_t *puVar9;
  fcolor *pfVar10;
  char *pcVar11;
  xr_sector_object *local_60;
  uint local_58;
  uint local_54;
  uint b;
  uint g;
  uint r;
  xr_sector_object *local_40;
  xr_sector_object *new_sector;
  sector_data_vec_cit end;
  sector_data_vec_cit it;
  xr_name_gen name;
  uint seed;
  uint16_t sector_idx;
  level_tools *this_local;
  
  pxVar4 = xray_re::xr_level::sectors(this->m_level);
  if (pxVar4 != (xr_level_sectors *)0x0) {
    xray_re::msg("building %s","sector.part");
    this_01 = xray_re::xr_scene::sectors(this->m_scene);
    pxVar5 = xray_re::xr_scene_objects::objects(&this_01->super_xr_scene_objects);
    this->m_scene_sectors = pxVar5;
    this_00 = this->m_scene_sectors;
    sVar6 = std::vector<xray_re::sector_data_*,_std::allocator<xray_re::sector_data_*>_>::size
                      (this->m_sectors);
    std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::reserve
              (this_00,sVar6);
    uVar3 = get_default_sector_idx(this);
    this->m_default_sector_idx = uVar3;
    uVar1 = this->m_default_sector_idx;
    sVar6 = std::vector<xray_re::sector_data_*,_std::allocator<xray_re::sector_data_*>_>::size
                      (this->m_sectors);
    xray_re::msg("selected sector #%u (of %Iu) as default",(ulong)uVar1,sVar6);
    name.m_offset._2_2_ = 0;
    name.m_next_idx = 0;
    xray_re::xr_name_gen::xr_name_gen((xr_name_gen *)&it,"sector",true);
    end._M_current =
         (sector_data **)
         std::vector<xray_re::sector_data_*,_std::allocator<xray_re::sector_data_*>_>::begin
                   (this->m_sectors);
    new_sector = (xr_sector_object *)
                 std::vector<xray_re::sector_data_*,_std::allocator<xray_re::sector_data_*>_>::end
                           (this->m_sectors);
    while (bVar2 = __gnu_cxx::operator!=
                             (&end,(__normal_iterator<xray_re::sector_data_*const_*,_std::vector<xray_re::sector_data_*,_std::allocator<xray_re::sector_data_*>_>_>
                                    *)&new_sector), bVar2) {
      this_02 = (xr_sector_object *)operator_new(0x98);
      xray_re::xr_sector_object::xr_sector_object(this_02,this->m_scene);
      local_40 = this_02;
      if (name.m_offset._2_2_ == this->m_default_sector_idx) {
        psVar7 = xray_re::xr_custom_object::co_name_abi_cxx11_((xr_custom_object *)this_02);
        std::__cxx11::string::operator=((string *)psVar7,"Sector_DEFAULT");
        puVar8 = xray_re::xr_custom_object::co_flags(&local_40->super_xr_custom_object);
        *(byte *)puVar8 = (byte)*puVar8 & 0xfd;
        puVar9 = xray_re::xr_sector_object::priv(local_40);
        *puVar9 = '\x01';
        pfVar10 = xray_re::xr_sector_object::color(local_40);
        xray_re::_color<float>::set(pfVar10,1.0,0.0,0.0,0.0);
      }
      else {
        pcVar11 = xray_re::xr_name_gen::get((xr_name_gen *)&it);
        psVar7 = xray_re::xr_custom_object::co_name_abi_cxx11_(&local_40->super_xr_custom_object);
        std::__cxx11::string::operator=((string *)psVar7,pcVar11);
        xray_re::xr_name_gen::next((xr_name_gen *)&it);
        puVar9 = xray_re::xr_sector_object::priv(local_40);
        *puVar9 = '\0';
        do {
          b = (uint)name.m_next_idx % 3;
          local_54 = (uint)(((ulong)(uint)name.m_next_idx / 3) % 3);
          local_58 = (uint)(((ulong)(uint)name.m_next_idx / 9) % 3);
          name.m_next_idx = name.m_next_idx + 1;
          bVar2 = invalid_sector_color(b,local_54,local_58);
        } while (bVar2);
        pfVar10 = xray_re::xr_sector_object::color(local_40);
        xray_re::_color<float>::set
                  (pfVar10,(float)b * 0.5,(float)local_54 * 0.5,(float)local_58 * 0.5,0.0);
      }
      local_60 = local_40;
      std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::
      push_back(this->m_scene_sectors,(value_type *)&local_60);
      __gnu_cxx::
      __normal_iterator<xray_re::sector_data_*const_*,_std::vector<xray_re::sector_data_*,_std::allocator<xray_re::sector_data_*>_>_>
      ::operator++(&end);
      name.m_offset._2_2_ = name.m_offset._2_2_ + 1;
    }
    xray_re::xr_name_gen::~xr_name_gen((xr_name_gen *)&it);
  }
  return;
}

Assistant:

void level_tools::reconstruct_sectors()
{
	if (m_level->sectors() == 0)
		return;
	msg("building %s", "sector.part");

	m_scene_sectors = &m_scene->sectors()->objects();
	m_scene_sectors->reserve(m_sectors->size());

	m_default_sector_idx = get_default_sector_idx();
	msg("selected sector #%u (of %" PRIuSIZET ") as default", m_default_sector_idx, m_sectors->size());

	uint16_t sector_idx = 0;
	unsigned seed = 0;
	xr_name_gen name("sector");
	for (sector_data_vec_cit it = m_sectors->begin(),
			end = m_sectors->end(); it != end; ++it, ++sector_idx) {
		xr_sector_object* new_sector = new xr_sector_object(*m_scene);
		if (sector_idx == m_default_sector_idx) {
			new_sector->co_name() = "Sector_DEFAULT";
			new_sector->co_flags() &= ~COF_VISIBLE;
			new_sector->priv() = true;
			new_sector->color().set(1.f, 0, 0, 0);
		} else {
			new_sector->co_name() = name.get();
			name.next();
			new_sector->priv() = false;
			unsigned r, g, b;
			do {
				r = seed%3;
				g = (seed/3)%3;
				b = (seed/9)%3;
				++seed;
			} while (invalid_sector_color(r, g, b));
			new_sector->color().set(r*0.5f, g*0.5f, b*0.5f);
		}
		m_scene_sectors->push_back(new_sector);
	}
}